

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

void busy_msleep(unsigned_long msec)

{
  unsigned_long uVar1;
  unsigned_long j;
  unsigned_long i;
  mbedtls_timing_hr_time hires;
  unsigned_long msec_local;
  
  hires.opaque._24_8_ = msec;
  mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&i,1);
  do {
    uVar1 = mbedtls_timing_get_timer((mbedtls_timing_hr_time *)&i,0);
  } while (uVar1 < (ulong)hires.opaque._24_8_);
  return;
}

Assistant:

static void busy_msleep( unsigned long msec )
{
    struct mbedtls_timing_hr_time hires;
    unsigned long i = 0; /* for busy-waiting */
    volatile unsigned long j; /* to prevent optimisation */

    (void) mbedtls_timing_get_timer( &hires, 1 );

    while( mbedtls_timing_get_timer( &hires, 0 ) < msec )
        i++;

    j = i;
    (void) j;
}